

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939acd.c
# Opt level: O2

int choose_new_sa(uint64_t name,int sa)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  
  if (((0xfd < sa) || ((addr[(uint)sa].flags & 1) == 0)) ||
     (addr[(uint)sa].name - 1 < name && addr[(uint)sa].name != name)) {
    piVar3 = &addr[0].flags;
    for (lVar1 = 0; lVar1 != 0xfe; lVar1 = lVar1 + 1) {
      if (((*piVar3 & 1) != 0) &&
         ((((anon_struct_16_2_f7718127 *)(piVar3 + -2))->name == 0 ||
          (((anon_struct_16_2_f7718127 *)(piVar3 + -2))->name == name)))) {
        return (int)lVar1;
      }
      piVar3 = piVar3 + 4;
    }
    iVar2 = 0xfe;
    do {
      bVar4 = iVar2 == 0;
      iVar2 = iVar2 + -1;
      if (bVar4) {
        return 0xfe;
      }
      bVar4 = 0xfc < sa;
      sa = sa + 1;
      if (bVar4) {
        sa = 0;
      }
    } while (((addr[sa].flags & 1) == 0) || (addr[sa].name <= name));
  }
  return sa;
}

Assistant:

static int choose_new_sa(uint64_t name, int sa)
{
	int j, cnt;

	/* test current entry */
	if ((sa < J1939_IDLE_ADDR) && (addr[sa].flags & F_USE)) {
		j = sa;
		if (!addr[j].name || (addr[j].name == name) || (addr[j].name > name))
			return j;
	}
	/* take first empty spot */
	for (j = 0; j < J1939_IDLE_ADDR; ++j) {
		if (!(addr[j].flags & F_USE))
			continue;
		if (!addr[j].name || (addr[j].name == name))
			return j;
	}

	/*
	 * no empty spot found
	 * take next (relative to @sa) spot that we can
	 * successfully contest
	 */
	j = sa + 1;
	for (cnt = 0; cnt < J1939_IDLE_ADDR; ++j, ++cnt) {
		if (j >= J1939_IDLE_ADDR)
			j = 0;
		if (!(addr[j].flags & F_USE))
			continue;
		if (name < addr[j].name)
			return j;
	}
	return J1939_IDLE_ADDR;
}